

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

void fblock(sunrealtype t,sunrealtype *cdata,int jx,int jy,sunrealtype *cdotdata,WebData wdata)

{
  int iblok;
  sunrealtype in_XMM2_Qa;
  
  WebRates((double)jx * wdata->dx,(double)jy * wdata->dy,in_XMM2_Qa,
           cdata + (long)(jy * wdata->mx + jx) * (long)wdata->ns,cdotdata,wdata);
  return;
}

Assistant:

static void fblock(sunrealtype t, sunrealtype cdata[], int jx, int jy,
                   sunrealtype cdotdata[], WebData wdata)
{
  int iblok, ic;
  sunrealtype x, y;

  iblok = jx + jy * (wdata->mx);
  y     = jy * (wdata->dy);
  x     = jx * (wdata->dx);
  ic    = (wdata->ns) * (iblok);
  WebRates(x, y, t, cdata + ic, cdotdata, wdata);
}